

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.h
# Opt level: O0

void pzgeom::TPZGeoQuad::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  int64_t iVar1;
  TPZVec<Fad<double>_> *in_RDX;
  TPZBaseMatrix *in_RDI;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *extraout_XMM0_Qa;
  int j;
  int i;
  int space;
  TPZFNMatrix<8,_Fad<double>_> dphi;
  TPZFNMatrix<4,_Fad<double>_> phi;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *this;
  Fad<double> *in_stack_fffffffffffffcb8;
  Fad<double> *this_00;
  int64_t in_stack_fffffffffffffcc8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffcd0;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  int iVar2;
  int local_30c;
  double in_stack_fffffffffffffd00;
  Fad<double> *in_stack_fffffffffffffd08;
  TPZFNMatrix<8,_Fad<double>_> *in_stack_fffffffffffffd10;
  
  this_00 = (Fad<double> *)0x4;
  TPZFNMatrix<4,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<4,_Fad<double>_> *)in_stack_fffffffffffffd10,
             (int64_t)in_stack_fffffffffffffd08,(int64_t)in_stack_fffffffffffffd00);
  TPZFNMatrix<8,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
             (int64_t)in_stack_fffffffffffffd00);
  pztopology::TPZQuadrilateral::TShape<Fad<double>>
            ((TPZVec<Fad<double>_> *)dphi.fBuf[1].dx_.ptr_to_data,
             (TPZFMatrix<Fad<double>_> *)dphi.fBuf[1].dx_._0_8_,
             (TPZFMatrix<Fad<double>_> *)dphi.fBuf[1].val_);
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  for (local_30c = 0; local_30c < (int)iVar1; local_30c = local_30c + 1) {
    TPZVec<Fad<double>_>::operator[](in_RDX,(long)local_30c);
    Fad<double>::operator=<double,_nullptr>(this_00,&in_stack_fffffffffffffcb8->val_);
    for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
      in_stack_fffffffffffffcb8 =
           TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(int64_t)this_00);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_30c,(long)iVar2);
      this = extraout_XMM0_Qa;
      operator*<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      TPZVec<Fad<double>_>::operator[](in_RDX,(long)local_30c);
      Fad<double>::operator+=
                ((Fad<double> *)CONCAT44(iVar2,in_stack_fffffffffffffce0),in_stack_fffffffffffffcd8)
      ;
      FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr(this);
    }
  }
  TPZFNMatrix<8,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<8,_Fad<double>_> *)0x16222cc);
  TPZFNMatrix<4,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<4,_Fad<double>_> *)0x16222d9);
  return;
}

Assistant:

inline void TPZGeoQuad::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<8,T> dphi(2,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 4; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
        
    }